

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::multalpha<Ptex::v2_4::PtexHalf>
               (PtexHalf *data,int npixels,int nchannels,int alphachan,float scale)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar2;
  int i;
  float aval;
  PtexHalf *end;
  int nchanmult;
  int alphaoffset;
  float in_stack_ffffffffffffffcc;
  int iVar3;
  int local_20;
  long local_8;
  
  local_20 = in_ECX;
  local_8 = in_RDI;
  if (in_ECX == 0) {
    local_8 = in_RDI + 2;
    local_20 = in_EDX + -1;
  }
  lVar1 = local_8 + (long)(in_ESI * in_EDX) * 2;
  for (; local_8 != lVar1; local_8 = local_8 + (long)in_EDX * 2) {
    fVar2 = PtexHalf::operator_cast_to_float((PtexHalf *)0x9a7461);
    fVar2 = in_XMM0_Da * fVar2;
    for (iVar3 = 0; iVar3 < local_20; iVar3 = iVar3 + 1) {
      PtexHalf::operator_cast_to_float((PtexHalf *)0x9a749a);
      PtexHalf::PtexHalf((PtexHalf *)CONCAT44(fVar2,iVar3),in_stack_ffffffffffffffcc);
      *(short *)(local_8 + (long)iVar3 * 2) = (short)((uint)in_stack_ffffffffffffffcc >> 0x10);
    }
  }
  return;
}

Assistant:

inline void multalpha(T* data, int npixels, int nchannels, int alphachan, float scale)
    {
        int alphaoffset; // offset to alpha chan from data ptr
        int nchanmult;   // number of channels to alpha-multiply
        if (alphachan == 0) {
            // first channel is alpha chan: mult the rest of the channels
            data++;
            alphaoffset = -1;
            nchanmult = nchannels - 1;
        }
        else {
            // mult all channels up to alpha chan
            alphaoffset = alphachan;
            nchanmult = alphachan;
        }

        for (T* end = data + npixels*nchannels; data != end; data += nchannels) {
            float aval = scale * (float)data[alphaoffset];
            for (int i = 0; i < nchanmult; i++) data[i] = T((float)data[i] * aval);
        }
    }